

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Var * __thiscall kratos::Generator::var(Generator *this,string *var_name,uint32_t width)

{
  Var *pVVar1;
  initializer_list<unsigned_int> __l;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint local_30;
  allocator_type local_29;
  
  local_30 = 1;
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__l,&local_29);
  pVVar1 = var(this,var_name,width,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return pVVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width) {
    return var(var_name, width, std::vector<uint32_t>{1});
}